

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O0

Aig_Man_t * Fra_ManPrepareComb(Fra_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Vec_Ptr_t **ppVVar6;
  int *piVar7;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pManFraig;
  Fra_Man_t *p_local;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraMan.c"
                  ,0xb5,"Aig_Man_t *Fra_ManPrepareComb(Fra_Man_t *)");
  }
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pManAig->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pManAig->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nRegs = p->pManAig->nRegs;
  p_00->nAsserts = p->pManAig->nAsserts;
  pAVar3 = Aig_ManConst1(p->pManAig);
  pAVar4 = Aig_ManConst1(p_00);
  Fra_ObjSetFraig(pAVar3,0,pAVar4);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pManAig->vCis), local_24 < iVar1;
      local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,local_24);
    pAVar4 = Aig_ObjCreateCi(p_00);
    Fra_ObjSetFraig(pAVar3,0,pAVar4);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p_00->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar5 = Vec_PtrEntry(p_00->vObjs,local_24);
    if (pvVar5 != (void *)0x0) {
      *(Fra_Man_t **)((long)pvVar5 + 0x28) = p;
    }
  }
  p->nMemAlloc = p->nSizeAlloc;
  ppVVar6 = (Vec_Ptr_t **)malloc((long)p->nMemAlloc << 3);
  p->pMemFanins = ppVVar6;
  memset(p->pMemFanins,0,(long)p->nMemAlloc << 3);
  piVar7 = (int *)malloc((long)p->nMemAlloc << 2);
  p->pMemSatNums = piVar7;
  memset(p->pMemSatNums,0,(long)p->nMemAlloc << 2);
  if (p_00->pData == (void *)0x0) {
    return p_00;
  }
  __assert_fail("pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraMan.c"
                ,0xca,"Aig_Man_t *Fra_ManPrepareComb(Fra_Man_t *)");
}

Assistant:

Aig_Man_t * Fra_ManPrepareComb( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pManFraig == NULL );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs    = p->pManAig->nRegs;
    pManFraig->nAsserts = p->pManAig->nAsserts;
    // set the pointers to the available fraig nodes
    Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), 0, Aig_ManConst1(pManFraig) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );
    // set the pointers to the manager
    Aig_ManForEachObj( pManFraig, pObj, i )
        pObj->pData = p;
    // allocate memory for mapping FRAIG nodes into SAT numbers and fanins
    p->nMemAlloc = p->nSizeAlloc;
    p->pMemFanins = ABC_ALLOC( Vec_Ptr_t *, p->nMemAlloc );
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    p->pMemSatNums = ABC_ALLOC( int, p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}